

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_device_uninit__null(ma_device *pDevice)

{
  ma_context *pmVar1;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x24f6,"void ma_device_uninit__null(ma_device *)");
  }
  ma_device_do_operation__null(pDevice,3);
  pmVar1 = (pDevice->field_23).null_device.operationCompletionEvent.pContext;
  if (pmVar1 != (ma_context *)0x0) {
    (*(pmVar1->field_22).posix.pthread_cond_destroy)
              ((undefined1 *)((long)&pDevice->field_23 + 0xa8));
    (*(((pDevice->field_23).null_device.operationCompletionEvent.pContext)->field_22).posix.
      pthread_mutex_destroy)((undefined1 *)((long)&pDevice->field_23 + 0x80));
  }
  pmVar1 = (pDevice->field_23).null_device.operationEvent.pContext;
  if (pmVar1 != (ma_context *)0x0) {
    (*(pmVar1->field_22).posix.pthread_cond_destroy)
              ((undefined1 *)((long)&pDevice->field_23 + 0x40));
    (*(((pDevice->field_23).null_device.operationEvent.pContext)->field_22).posix.
      pthread_mutex_destroy)((undefined1 *)((long)&pDevice->field_23 + 0x18));
    return;
  }
  return;
}

Assistant:

static void ma_device_uninit__null(ma_device* pDevice)
{
    MA_ASSERT(pDevice != NULL);

    /* Keep it clean and wait for the device thread to finish before returning. */
    ma_device_do_operation__null(pDevice, MA_DEVICE_OP_KILL__NULL);

    /* At this point the loop in the device thread is as good as terminated so we can uninitialize our events. */
    ma_event_uninit(&pDevice->null_device.operationCompletionEvent);
    ma_event_uninit(&pDevice->null_device.operationEvent);
}